

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::quadratic_cost_type
          (quadratic_cost_type<float> *this,objective_function *obj_,int n)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  objective_function *poVar4;
  float *pfVar5;
  pointer poVar6;
  pointer poVar7;
  int *piVar8;
  pointer poVar9;
  pointer poVar10;
  quad *pqVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  
  this->obj = obj_;
  std::make_unique<float[]>((size_t)&this->linear_elements);
  std::make_unique<baryonyx::itm::quadratic_cost_type<float>::quad[]>
            ((size_t)&this->quadratic_elements);
  std::make_unique<int[]>((size_t)&this->indices);
  poVar4 = this->obj;
  pfVar5 = (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
           _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  poVar6 = (poVar4->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar7 = (poVar4->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar14 = 0; ((long)poVar7 - (long)poVar6 & 0xffffffff0U) != uVar14; uVar14 = uVar14 + 0x10) {
    iVar13 = *(int *)((long)&poVar6->variable_index + uVar14);
    lVar16 = (long)iVar13;
    if ((lVar16 < 0) || (n <= iVar13)) {
      details::fail_fast("Postcondition",
                         "0 <= obj.elements[i].variable_index && obj.elements[i].variable_index < n"
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                         ,"1173");
    }
    pfVar5[lVar16] = (float)*(double *)((long)&poVar6->factor + uVar14) + pfVar5[lVar16];
  }
  piVar8 = (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  iVar13 = 0;
  *piVar8 = 0;
  uVar14 = 0;
  do {
    uVar15 = uVar14;
    if (uVar15 == (uint)n) {
      iVar13 = 0;
      for (iVar12 = 0; iVar12 != n; iVar12 = iVar12 + 1) {
        poVar9 = (poVar4->qelements).
                 super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar10 = (poVar4->qelements).
                  super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pqVar11 = (this->quadratic_elements)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
                  _M_head_impl;
        for (uVar14 = 0; ((long)poVar10 - (long)poVar9 & 0xffffffff0U) != uVar14;
            uVar14 = uVar14 + 0x10) {
          iVar2 = *(int *)((long)&poVar9->variable_index_a + uVar14);
          iVar3 = *(int *)((long)&poVar9->variable_index_b + uVar14);
          if ((iVar2 == iVar12) || (iVar3 == iVar12)) {
            if (iVar2 != iVar12) {
              iVar3 = iVar2;
            }
            pqVar11[iVar13].factor = (float)*(double *)((long)&poVar9->factor + uVar14);
            pqVar11[iVar13].id = iVar3;
            iVar13 = iVar13 + 1;
          }
        }
      }
      return;
    }
    (piVar8 + 1)[uVar15] = iVar13;
    poVar9 = (poVar4->qelements).
             super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    poVar10 = (poVar4->qelements).
              super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (uVar17 = 0; uVar14 = uVar15 + 1, ((long)poVar10 - (long)poVar9 & 0xffffffff0U) != uVar17;
        uVar17 = uVar17 + 0x10) {
      iVar12 = *(int *)((long)&poVar9->variable_index_a + uVar17);
      if (((long)iVar12 < 0) || (n <= iVar12)) {
        details::fail_fast("Postcondition",
                           "0 <= obj.qelements[i].variable_index_a && obj.qelements[i].variable_index_a < n"
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                           ,"1185");
      }
      uVar1 = *(uint *)((long)&poVar9->variable_index_b + uVar17);
      if (((long)(int)uVar1 < 0) || ((uint)n <= uVar1)) {
        details::fail_fast("Postcondition",
                           "0 <= obj.qelements[i].variable_index_b && obj.qelements[i].variable_index_b < n"
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                           ,"1187");
      }
      if ((uVar15 == (long)iVar12) || (uVar15 == (long)(int)uVar1)) {
        iVar13 = iVar13 + 1;
        piVar8[uVar15 + 1] = iVar13;
      }
    }
  } while( true );
}

Assistant:

quadratic_cost_type(const objective_function& obj_, int n)
      : obj(obj_)
      , linear_elements(std::make_unique<Float[]>(n))
      , quadratic_elements(
          std::make_unique<quad[]>(2 * obj.qelements.size() + 1))
      , indices(std::make_unique<int[]>(n + 1))
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i) {
            bx_ensures(0 <= obj.elements[i].variable_index &&
                       obj.elements[i].variable_index < n);

            linear_elements[obj.elements[i].variable_index] +=
              static_cast<Float>(obj.elements[i].factor);
        }

        indices[0] = 0;
        for (int var = 0; var != n; ++var) {
            indices[var + 1] = indices[var];

            for (int i = 0, e = length(obj.qelements); i != e; ++i) {
                bx_ensures(0 <= obj.qelements[i].variable_index_a &&
                           obj.qelements[i].variable_index_a < n);
                bx_ensures(0 <= obj.qelements[i].variable_index_b &&
                           obj.qelements[i].variable_index_b < n);

                if (var == obj.qelements[i].variable_index_a ||
                    var == obj.qelements[i].variable_index_b)
                    ++indices[var + 1];
            }
        }

        for (int id = 0, var = 0; var != n; ++var) {
            for (int i = 0, e = length(obj.qelements); i != e; ++i) {
                const bool is_a = obj.qelements[i].variable_index_a == var;
                const bool is_b = obj.qelements[i].variable_index_b == var;

                if (is_a || is_b) {
                    quadratic_elements[id].factor =
                      static_cast<Float>(obj.qelements[i].factor);
                    quadratic_elements[id].id =
                      is_a ? obj.qelements[i].variable_index_b
                           : obj.qelements[i].variable_index_a;
                    ++id;
                }
            }
        }
    }